

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QCommonArrayOps<QLoggingRule>::growAppend
          (QCommonArrayOps<QLoggingRule> *this,QLoggingRule *b,QLoggingRule *e)

{
  QLoggingRule *pQVar1;
  long n;
  long in_FS_OFFSET;
  QArrayDataPointer<QLoggingRule> local_38;
  QLoggingRule *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = b;
  if (b != e) {
    n = ((long)e - (long)b >> 3) * -0x3333333333333333;
    local_38.d = (Data *)0x0;
    local_38.ptr = (QLoggingRule *)0x0;
    local_38.size = 0;
    pQVar1 = (this->super_Type).super_QGenericArrayOps<QLoggingRule>.
             super_QArrayDataPointer<QLoggingRule>.ptr;
    if ((b < pQVar1) ||
       (pQVar1 + (this->super_Type).super_QGenericArrayOps<QLoggingRule>.
                 super_QArrayDataPointer<QLoggingRule>.size <= b)) {
      QArrayDataPointer<QLoggingRule>::detachAndGrow
                ((QArrayDataPointer<QLoggingRule> *)this,GrowsAtEnd,n,(QLoggingRule **)0x0,
                 (QArrayDataPointer<QLoggingRule> *)0x0);
    }
    else {
      QArrayDataPointer<QLoggingRule>::detachAndGrow
                ((QArrayDataPointer<QLoggingRule> *)this,GrowsAtEnd,n,&local_20,&local_38);
    }
    QGenericArrayOps<QLoggingRule>::copyAppend
              ((QGenericArrayOps<QLoggingRule> *)this,local_20,
               (QLoggingRule *)(((long)e - (long)b) + (long)local_20));
    QArrayDataPointer<QLoggingRule>::~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }